

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDynCalls.cpp
# Opt level: O3

void __thiscall wasm::GenerateDynCalls::visitFunction(GenerateDynCalls *this,Function *func)

{
  char *pcVar1;
  bool bVar2;
  size_t sVar3;
  Iterator __first;
  Signature sig_00;
  Iterator __last;
  undefined1 local_58 [8];
  Signature sig;
  vector<wasm::Type,_std::allocator<wasm::Type>_> newParams;
  HeapType local_28;
  
  pcVar1 = (func->super_Importable).module.super_IString.str._M_str;
  if ((pcVar1 != (char *)0x0) && (pcVar1 == DAT_010b0e58)) {
    bVar2 = IString::startsWith<8>
                      (&(func->super_Importable).base.super_IString,(char (*) [8])"invoke_");
    if (bVar2) {
      _local_58 = HeapType::getSignature(&func->type);
      sVar3 = wasm::Type::size((Type *)local_58);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 1;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)local_58;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = sVar3;
      __last.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)local_58;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&sig.results,__first,__last,
                 (allocator_type *)&local_28);
      wasm::Type::Type((Type *)&newParams.
                                super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(Tuple *)&sig.results);
      sig_00.results.id = sig.params.id;
      sig_00.params.id =
           (uintptr_t)
           newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      HeapType::HeapType(&local_28,sig_00);
      InsertOrderedSet<wasm::HeapType>::insert(&this->invokeTypes,&local_28);
      if (sig.results.id != 0) {
        operator_delete((void *)sig.results.id,
                        (long)newParams.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                              _M_impl.super__Vector_impl_data._M_finish - sig.results.id);
      }
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    // Generate dynCalls for invokes
    if (func->imported() && func->module == ENV &&
        func->base.startsWith("invoke_")) {
      Signature sig = func->type.getSignature();
      // The first parameter is a pointer to the original function that's called
      // by the invoke, so skip it
      std::vector<Type> newParams(sig.params.begin() + 1, sig.params.end());
      invokeTypes.insert(Signature(Type(newParams), sig.results));
    }
  }